

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTD_isRLE(BYTE *src,size_t length)

{
  byte bVar1;
  BYTE *pBVar2;
  size_t sVar3;
  BYTE *in_RSI;
  byte *in_RDI;
  size_t u;
  size_t i;
  size_t prefixLength;
  size_t unrollMask;
  size_t unrollSize;
  size_t valueST;
  BYTE value;
  BYTE *ip;
  ulong local_58;
  BYTE *local_50;
  undefined7 in_stack_ffffffffffffffd8;
  int local_4;
  
  bVar1 = *in_RDI;
  local_50 = (BYTE *)((ulong)in_RSI & 0x1f);
  if (in_RSI == (BYTE *)0x1) {
    local_4 = 1;
  }
  else if ((local_50 == (BYTE *)0x0) ||
          (pBVar2 = (BYTE *)ZSTD_count(in_RSI,in_RDI,
                                       (BYTE *)CONCAT17(bVar1,in_stack_ffffffffffffffd8)),
          pBVar2 == local_50 + -1)) {
    for (; local_50 != in_RSI; local_50 = local_50 + 0x20) {
      for (local_58 = 0; local_58 < 0x20; local_58 = local_58 + 8) {
        sVar3 = MEM_readST(in_RDI + (long)local_50 + local_58);
        if (sVar3 != (ulong)bVar1 * 0x101010101010101) {
          return 0;
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        size_t u;
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
    }   }   }
    return 1;
}